

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

int parse_cli(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long in_FS_OFFSET;
  socket_config *local_30;
  socket_config *current_config;
  cli_parse_state state;
  char **argv_local;
  int argc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  current_config._4_4_ = 0;
  do {
    switch(current_config._4_4_) {
    case 0:
      _optind = 1;
      current_config._4_4_ = 1;
      break;
    case 2:
      local_30 = extend_socket_config();
      pcVar2 = argv[_optind];
      sVar5 = strlen(argv[_optind]);
      iVar4 = strncasecmp(pcVar2,"tcp",sVar5);
      if (iVar4 != 0) {
        pcVar2 = argv[_optind];
        sVar5 = strlen(argv[_optind]);
        iVar4 = strncasecmp(pcVar2,"ssh",sVar5);
        if (iVar4 != 0) {
          print_error_exit("\"%s\" is not a valid socket type\n",argv[_optind]);
        }
        print_error_exit("ssh support disabled at compile time\n");
      }
      current_config._4_4_ = 3;
      local_30->type = SOCKET_TYPE_TCP;
      if (argc - _optind < 2) {
        print_error_exit("Not enough arguments for tcp socket");
      }
      _optind = _optind + 1;
      break;
    case 4:
      _Var3 = is_resolveable_host(argv[_optind]);
      if (!_Var3) {
        print_error_exit("cannot resolve \"%s\"\n",argv[_optind]);
      }
      lVar6 = (long)_optind;
      _optind = _optind + 1;
      local_30->host = argv[lVar6];
      current_config._4_4_ = 5;
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return 0;
    }
    if (argc <= _optind) {
      current_config._4_4_ = 6;
    }
  } while( true );
}

Assistant:

static int parse_cli(int argc, char **argv)
{
	enum cli_parse_state {
		CLI_PARSE_STATE_BEGIN,
		CLI_PARSE_STATE_GLOBAL_OPTS,
		CLI_PARSE_STATE_SOCKET_BEGIN,
		CLI_PARSE_STATE_SOCKET_TCP_OPTIONS,
		CLI_PARSE_STATE_SOCKET_TCP_HOST,
		CLI_PARSE_STATE_SOCKET_TCP_PORT,
#ifdef RTRLIB_HAVE_LIBSSH
		CLI_PARSE_STATE_SOCKET_SSH_OPTIONS,
		CLI_PARSE_STATE_SOCKET_SSH_HOST,
		CLI_PARSE_STATE_SOCKET_SSH_PORT,
		CLI_PARSE_STATE_SOCKET_SSH_USERNAME,
		CLI_PARSE_STATE_SOCKET_SSH_PRIVATE_KEY_PASSWORD,
		CLI_PARSE_STATE_SOCKET_SSH_HOST_KEY,
#endif
		CLI_PARSE_STATE_END,
	};

	enum cli_parse_state state = CLI_PARSE_STATE_BEGIN;

	struct socket_config *current_config;

	while (true) {
		switch (state) {
		case CLI_PARSE_STATE_BEGIN:
			optind = 1;
			state = CLI_PARSE_STATE_GLOBAL_OPTS;
			break;

		case CLI_PARSE_STATE_GLOBAL_OPTS:
			parse_global_opts(argc, argv);

			state = CLI_PARSE_STATE_SOCKET_BEGIN;
			break;

		case CLI_PARSE_STATE_SOCKET_BEGIN:
			current_config = extend_socket_config();

			if (strncasecmp(argv[optind], "tcp", strlen(argv[optind])) == 0) {
				state = CLI_PARSE_STATE_SOCKET_TCP_OPTIONS;
				current_config->type = SOCKET_TYPE_TCP;

				/* Check if enough arguments are available
				 * to configure this socket.
				 * This does not account for options.
				 */
				if ((argc - optind) < 2)
					print_error_exit("Not enough arguments for tcp socket");

			} else if (strncasecmp(argv[optind], "ssh", strlen(argv[optind])) == 0) {
#ifdef RTRLIB_HAVE_LIBSSH
				state = CLI_PARSE_STATE_SOCKET_SSH_OPTIONS;
				current_config->type = SOCKET_TYPE_SSH;

				/* Check if enough arguments are available
				 * to configure this socket.
				 * This does not account for options.
				 */
				if ((argc - optind) < 4)
					print_error_exit("Not enough arguments for ssh socket");
#else
				print_error_exit("ssh support disabled at compile time\n");
#endif

			} else {
				print_error_exit("\"%s\" is not a valid socket type\n", argv[optind]);
				break;
			}

			++optind;
			break;

		case CLI_PARSE_STATE_SOCKET_TCP_OPTIONS:
			parse_socket_opts(argc, argv, current_config);

			/* Check again if enough arguments are available,
			 * accounting for options
			 */
			if ((argc - optind) < 2)
				print_error_exit("Not enough arguments for tcp socket");

			state = CLI_PARSE_STATE_SOCKET_TCP_HOST;
			break;

		case CLI_PARSE_STATE_SOCKET_TCP_HOST:
			if (!is_resolveable_host(argv[optind]))
				print_error_exit("cannot resolve \"%s\"\n", argv[optind]);

			current_config->host = argv[optind++];

			state = CLI_PARSE_STATE_SOCKET_TCP_PORT;
			break;

		case CLI_PARSE_STATE_SOCKET_TCP_PORT:
			if (!is_valid_port_number(argv[optind]))
				print_error_exit("\"%s\" is not a valid port number\n", argv[optind]);

			current_config->port = argv[optind++];

			state = CLI_PARSE_STATE_SOCKET_BEGIN;
			break;

#ifdef RTRLIB_HAVE_LIBSSH
		case CLI_PARSE_STATE_SOCKET_SSH_OPTIONS:
			parse_socket_opts(argc, argv, current_config);

			/* Check again if enough arguments are available,
			 * accounting for options
			 */
			if ((argc - optind) < 4)
				print_error_exit("Not enough arguments for ssh socket");

			state = CLI_PARSE_STATE_SOCKET_SSH_HOST;
			break;

		case CLI_PARSE_STATE_SOCKET_SSH_HOST:
			if (!is_resolveable_host(argv[optind]))
				print_error_exit("cannot resolve \"%s\"\n", argv[optind]);

			current_config->host = argv[optind++];

			state = CLI_PARSE_STATE_SOCKET_SSH_PORT;
			break;

		case CLI_PARSE_STATE_SOCKET_SSH_PORT:
			if (!is_valid_port_number(argv[optind]))
				print_error_exit("\"%s\" is not a valid port number\n", argv[optind]);

			current_config->port = argv[optind++];

			state = CLI_PARSE_STATE_SOCKET_SSH_USERNAME;
			break;

		case CLI_PARSE_STATE_SOCKET_SSH_USERNAME:
			current_config->ssh_username = argv[optind++];

			state = CLI_PARSE_STATE_SOCKET_SSH_PRIVATE_KEY_PASSWORD;
			break;

		case CLI_PARSE_STATE_SOCKET_SSH_PRIVATE_KEY_PASSWORD:
			if (current_config->force_key && !is_readable_file(argv[optind])) {
				print_error_exit("\"%s\" is not a readable file\n", argv[optind]);

			} else if (!current_config->force_password && !current_config->force_key &&
				   is_readable_file(argv[optind])) {
				current_config->ssh_private_key = argv[optind];

			} else if (!current_config->force_password && is_utf8(argv[optind])) {
				fprintf(stderr, "\"%s\" does not seem to be a file. Trying password authentication.\n",
					argv[optind]);
				fprintf(stderr, "Use -r to force key authentication or -w to silence this warning");
				current_config->ssh_password = argv[optind];

			} else if (current_config->force_password && !is_utf8(argv[optind])) {
				print_error_exit("\"%s\" is not a valid utf8 string", argv[optind]);

			} else if (current_config->force_password && !current_config->force_key &&
				   is_utf8(argv[optind])) {
				current_config->ssh_password = argv[optind];

			} else {
				print_error_exit("\"%s\" is neither a readable file nor a valid utf8 string",
						 argv[optind]);
			}

			++optind;
			state = CLI_PARSE_STATE_SOCKET_SSH_HOST_KEY;
			break;

		case CLI_PARSE_STATE_SOCKET_SSH_HOST_KEY:
			if (strncasecmp(argv[optind], "tcp", strlen(argv[optind])) == 0 ||
			    strncasecmp(argv[optind], "ssh", strlen(argv[optind])) == 0) {
				state = CLI_PARSE_STATE_SOCKET_BEGIN;
				break;
			}

			if (!is_readable_file(argv[optind]))
				print_error_exit("\"%s\" is not a readable file\n", argv[optind]);

			current_config->ssh_host_key = argv[optind++];

			state = CLI_PARSE_STATE_SOCKET_BEGIN;
			break;
#endif

		case CLI_PARSE_STATE_END:
			return 0;
		}

		if (optind >= argc)
			state = CLI_PARSE_STATE_END;
	}
}